

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_brick_tec
          (REF_NODE ref_node,REF_CELL ref_cell,REF_LONG ncell_expected,REF_GLOB *l2c,REF_BOOL binary
          ,FILE *file)

{
  REF_MPI ref_mpi_00;
  REF_STATUS RVar1;
  uint uVar2;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  int int_node_1;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  int int_node;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ncell_actual;
  int local_200;
  REF_INT ncell;
  REF_INT part;
  REF_INT proc;
  REF_GLOB *c2n;
  REF_INT node_per;
  REF_GLOB globals [27];
  REF_GLOB brick [8];
  REF_INT nodes [27];
  int local_50;
  int local_4c;
  REF_INT node;
  REF_INT cell;
  REF_MPI ref_mpi;
  FILE *file_local;
  REF_BOOL binary_local;
  REF_GLOB *l2c_local;
  REF_LONG ncell_expected_local;
  REF_CELL ref_cell_local;
  REF_NODE ref_node_local;
  
  ref_mpi_00 = ref_node->ref_mpi;
  c2n._4_4_ = ref_cell->node_per;
  if (ref_mpi_00->id == 0) {
    for (local_4c = 0; local_4c < ref_cell->max; local_4c = local_4c + 1) {
      RVar1 = ref_cell_nodes(ref_cell,local_4c,(REF_INT *)(brick + 7));
      if (RVar1 == 0) {
        uVar2 = ref_cell_part(ref_cell,ref_node,local_4c,&local_200);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x209,"ref_gather_brick_tec",(ulong)uVar2,"part");
          return uVar2;
        }
        if (ref_mpi_00->id == local_200) {
          for (local_50 = 0; local_50 < c2n._4_4_; local_50 = local_50 + 1) {
            globals[(long)local_50 + -1] = l2c[nodes[(long)local_50 + -2]];
          }
          uVar2 = ref_cell->node_per - 4;
          if (3 < uVar2 && ref_cell->node_per != 8) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x21c,"ref_gather_brick_tec",6,"wrong nodes per cell");
            return 6;
          }
          RVar1 = (*(code *)(&DAT_002e04e0 + *(int *)(&DAT_002e04e0 + (ulong)uVar2 * 4)))();
          return RVar1;
        }
      }
    }
  }
  if (ref_mpi_00->id == 0) {
    for (ncell = 1; ncell < ref_mpi_00->n; ncell = ncell + 1) {
      uVar2 = ref_mpi_gather_recv(ref_mpi_00,(void *)((long)&ncell_actual + 4),1,1,ncell);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x234,"ref_gather_brick_tec",(ulong)uVar2,"recv ncell");
        return uVar2;
      }
      if (ncell_actual._4_4_ * c2n._4_4_ < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x235,"ref_gather_brick_tec","malloc c2n of REF_GLOB negative");
        return 1;
      }
      _part = malloc((long)(ncell_actual._4_4_ * c2n._4_4_) << 3);
      if (_part == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x235,"ref_gather_brick_tec","malloc c2n of REF_GLOB NULL");
        return 2;
      }
      uVar2 = ref_mpi_gather_recv(ref_mpi_00,_part,ncell_actual._4_4_ * c2n._4_4_,2,ncell);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x238,"ref_gather_brick_tec",(ulong)uVar2,"recv c2n");
        return uVar2;
      }
      if (0 < ncell_actual._4_4_) {
        uVar2 = ref_cell->node_per - 4;
        if (3 < uVar2 && ref_cell->node_per != 8) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x248,"ref_gather_brick_tec",6,"wrong nodes per cell");
          return 6;
        }
        RVar1 = (*(code *)(&DAT_002e04cc + *(int *)(&DAT_002e04cc + (ulong)uVar2 * 4)))();
        return RVar1;
      }
      if (_part != (void *)0x0) {
        free(_part);
      }
    }
  }
  else {
    ncell_actual._4_4_ = 0;
    for (local_4c = 0; local_4c < ref_cell->max; local_4c = local_4c + 1) {
      RVar1 = ref_cell_nodes(ref_cell,local_4c,(REF_INT *)(brick + 7));
      if (RVar1 == 0) {
        uVar2 = ref_cell_part(ref_cell,ref_node,local_4c,&local_200);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x25f,"ref_gather_brick_tec",(ulong)uVar2,"part");
          return uVar2;
        }
        if (ref_mpi_00->id == local_200) {
          ncell_actual._4_4_ = ncell_actual._4_4_ + 1;
        }
      }
    }
    uVar2 = ref_mpi_gather_send(ref_mpi_00,(void *)((long)&ncell_actual + 4),1,1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x262,"ref_gather_brick_tec",(ulong)uVar2,"send ncell");
      return uVar2;
    }
    if (ncell_actual._4_4_ * c2n._4_4_ < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x263,"ref_gather_brick_tec","malloc c2n of REF_GLOB negative");
      return 1;
    }
    _part = malloc((long)(ncell_actual._4_4_ * c2n._4_4_) << 3);
    if (_part == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x263,"ref_gather_brick_tec","malloc c2n of REF_GLOB NULL");
      return 2;
    }
    ncell_actual._4_4_ = 0;
    for (local_4c = 0; local_4c < ref_cell->max; local_4c = local_4c + 1) {
      RVar1 = ref_cell_nodes(ref_cell,local_4c,(REF_INT *)(brick + 7));
      if (RVar1 == 0) {
        uVar2 = ref_cell_part(ref_cell,ref_node,local_4c,&local_200);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x266,"ref_gather_brick_tec",(ulong)uVar2,"part");
          return uVar2;
        }
        if (ref_mpi_00->id == local_200) {
          for (local_50 = 0; local_50 < c2n._4_4_; local_50 = local_50 + 1) {
            *(REF_GLOB *)((long)_part + (long)(local_50 + c2n._4_4_ * ncell_actual._4_4_) * 8) =
                 l2c[nodes[(long)local_50 + -2]];
          }
          ncell_actual._4_4_ = ncell_actual._4_4_ + 1;
        }
      }
    }
    uVar2 = ref_mpi_gather_send(ref_mpi_00,_part,ncell_actual._4_4_ * c2n._4_4_,2);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x26e,"ref_gather_brick_tec",(ulong)uVar2,"send c2n");
      return uVar2;
    }
    if (_part != (void *)0x0) {
      free(_part);
    }
  }
  if ((ref_mpi_00->id == 0) && (ncell_expected != 0)) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x274,
           "ref_gather_brick_tec","cell count mismatch",ncell_expected,0);
    ref_node_local._4_4_ = 1;
  }
  else {
    ref_node_local._4_4_ = 0;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_brick_tec(REF_NODE ref_node,
                                               REF_CELL ref_cell,
                                               REF_LONG ncell_expected,
                                               REF_GLOB *l2c, REF_BOOL binary,
                                               FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB brick[8];
  REF_GLOB globals[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_GLOB *c2n;
  REF_INT proc, part, ncell;
  REF_LONG ncell_actual;

  ncell_actual = 0;

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (node = 0; node < node_per; node++) {
          globals[node] = l2c[nodes[node]];
        }
        switch (ref_cell_node_per(ref_cell)) {
          case 4:
            REF_CELL_TEC_BRICK_TET(brick, globals);
            break;
          case 5:
            REF_CELL_TEC_BRICK_PYR(brick, globals);
            break;
          case 6:
            REF_CELL_TEC_BRICK_PRI(brick, globals);
            break;
          case 8:
            REF_CELL_TEC_BRICK_HEX(brick, globals);
            break;
          default:
            RSS(REF_IMPLEMENT, "wrong nodes per cell");
            break;
        }
        if (binary) {
          for (node = 0; node < 8; node++) {
            int int_node;
            int_node = (int)brick[node]; /* binary zero-based */
            REIS(1, fwrite(&int_node, sizeof(int), 1, file), "int c2n");
          }
        } else {
          for (node = 0; node < 8; node++) {
            brick[node]++; /* ascii one-based */
            fprintf(file, " " REF_GLOB_FMT, brick[node]);
          }
          fprintf(file, "\n");
        }
        ncell_actual++;
      }
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      ref_malloc(c2n, ncell * node_per, REF_GLOB);
      RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE,
                              proc),
          "recv c2n");
      for (cell = 0; cell < ncell; cell++) {
        switch (ref_cell_node_per(ref_cell)) {
          case 4:
            REF_CELL_TEC_BRICK_TET(brick, &(c2n[node_per * cell]));
            break;
          case 5:
            REF_CELL_TEC_BRICK_PYR(brick, &(c2n[node_per * cell]));
            break;
          case 6:
            REF_CELL_TEC_BRICK_PRI(brick, &(c2n[node_per * cell]));
            break;
          case 8:
            REF_CELL_TEC_BRICK_HEX(brick, &(c2n[node_per * cell]));
            break;
          default:
            RSS(REF_IMPLEMENT, "wrong nodes per cell");
            break;
        }
        if (binary) {
          for (node = 0; node < 8; node++) {
            int int_node;
            int_node = (int)brick[node]; /* binary zero-based */
            REIS(1, fwrite(&int_node, sizeof(int), 1, file), "int c2n");
          }
        } else {
          for (node = 0; node < 8; node++) {
            brick[node]++; /* ascii one-based */
            fprintf(file, " " REF_GLOB_FMT, brick[node]);
          }
          fprintf(file, "\n");
        }
        ncell_actual++;
      }
      ref_free(c2n);
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) ncell++;
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    ref_malloc(c2n, ncell * node_per, REF_GLOB);
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (node = 0; node < node_per; node++)
          c2n[node + node_per * ncell] = l2c[nodes[node]];
        ncell++;
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE),
        "send c2n");

    ref_free(c2n);
  }

  if (ref_mpi_once(ref_mpi)) {
    REIS(ncell_expected, ncell_actual, "cell count mismatch");
  }

  return REF_SUCCESS;
}